

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QByteArray * QString::toLatin1_helper_inplace(QString *s)

{
  long lVar1;
  QStringView string;
  bool bVar2;
  QArrayDataPointer<char16_t> *pQVar3;
  QArrayDataPointer<char16_t> *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  char16_t *sdata;
  qsizetype length;
  QArrayDataPointer<char> ba_d;
  DataPointer *in_stack_ffffffffffffff78;
  uchar *in_stack_ffffffffffffff80;
  QArrayDataPointer<char> *this;
  QStringView *this_00;
  QStringView *pQVar4;
  Data *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar4 = in_RDI;
  bVar2 = isDetached((QString *)0x512a6d);
  if (bVar2) {
    size((QString *)in_RSI);
    pQVar3 = (QArrayDataPointer<char16_t> *)QArrayDataPointer<char16_t>::operator->(in_RSI);
    pQVar3 = (QArrayDataPointer<char16_t> *)QArrayDataPointer<char16_t>::data(pQVar3);
    qt_to_latin1(in_stack_ffffffffffffff80,(char16_t *)in_stack_ffffffffffffff78,0x512ad4);
    this = (QArrayDataPointer<char> *)&stack0xffffffffffffffc8;
    QArrayDataPointer<char16_t>::reinterpreted<char>(pQVar3);
    QByteArray::QByteArray((QByteArray *)this,in_stack_ffffffffffffff78);
    QArrayDataPointer<char>::~QArrayDataPointer(this);
  }
  else {
    QStringView::QStringView<QString,_true>(this_00,(QString *)in_RDI);
    string.m_data = (storage_type_conflict *)in_stack_ffffffffffffffc8;
    string.m_size = (qsizetype)pQVar4;
    qt_convert_to_latin1(string);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QByteArray *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QString::toLatin1_helper_inplace(QString &s)
{
    if (!s.isDetached())
        return qt_convert_to_latin1(s);

    // We can return our own buffer to the caller.
    // Conversion to Latin-1 always shrinks the buffer by half.
    // This relies on the fact that we use QArrayData for everything behind the scenes

    // First, do the in-place conversion. Since isDetached() == true, the data
    // was allocated by QArrayData, so the null terminator must be there.
    qsizetype length = s.size();
    char16_t *sdata = s.d->data();
    Q_ASSERT(sdata[length] == u'\0');
    qt_to_latin1(reinterpret_cast<uchar *>(sdata), sdata, length + 1);

    // Move the internals over to the byte array.
    // Kids, avert your eyes. Don't try this at home.
    auto ba_d = std::move(s.d).reinterpreted<char>();

    // Some sanity checks
    Q_ASSERT(ba_d.d->allocatedCapacity() >= ba_d.size);
    Q_ASSERT(s.isNull());
    Q_ASSERT(s.isEmpty());
    Q_ASSERT(s.constData() == QString().constData());

    return QByteArray(std::move(ba_d));
}